

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Printer::PrintToString(Printer *this,Message *message,string *output)

{
  byte bVar1;
  StringOutputStream output_stream;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined8 in_stack_ffffffffffffffa0;
  Message *in_stack_ffffffffffffffa8;
  Printer *in_stack_ffffffffffffffb0;
  
  std::__cxx11::string::clear();
  io::StringOutputStream::StringOutputStream
            ((StringOutputStream *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             (string *)&stack0xffffffffffffff88);
  bVar1 = Print(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                (ZeroCopyOutputStream *)in_stack_ffffffffffffffa0);
  io::StringOutputStream::~StringOutputStream((StringOutputStream *)0x706c78);
  return (bool)(bVar1 & 1);
}

Assistant:

bool TextFormat::Printer::PrintToString(const Message& message,
                                        std::string* output) const {
  GOOGLE_DCHECK(output) << "output specified is nullptr";

  output->clear();
  io::StringOutputStream output_stream(output);

  return Print(message, &output_stream);
}